

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

action __thiscall
Search::search::predict
          (search *this,example *ec,ptag mytag,action *oracle_actions,size_t oracle_actions_cnt,
          ptag *condition_on,char *condition_on_names,action *allowed_actions,
          size_t allowed_actions_cnt,float *allowed_actions_cost,size_t learner_id,float weight)

{
  ulong uVar1;
  pointer *ppuVar2;
  search_private *psVar3;
  iterator __position;
  action_repr *paVar4;
  long lVar5;
  action aVar6;
  features *pfVar7;
  ulong uVar8;
  float loss;
  action_repr item;
  action a;
  size_t local_48;
  action *local_40;
  float a_cost;
  
  a_cost = 0.0;
  local_40 = oracle_actions;
  a = search_predict(this->priv,ec,1,mytag,oracle_actions,oracle_actions_cnt,condition_on,
                     condition_on_names,allowed_actions,allowed_actions_cnt,allowed_actions_cost,
                     learner_id,&a_cost,weight);
  psVar3 = this->priv;
  if (psVar3->state == INIT_TEST) {
    __position._M_current =
         (psVar3->test_action_sequence).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (psVar3->test_action_sequence).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&psVar3->test_action_sequence,
                 __position,&a);
    }
    else {
      *__position._M_current = a;
      ppuVar2 = &(psVar3->test_action_sequence).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + 1;
    }
  }
  if (mytag != 0) {
    uVar8 = (ulong)mytag;
    paVar4 = (this->priv->ptag_to_action)._begin;
    if (uVar8 < (ulong)((long)(this->priv->ptag_to_action)._end - (long)paVar4 >> 4)) {
      pfVar7 = paVar4[uVar8].repr;
      if (pfVar7 != (features *)0x0) {
        features::delete_v(pfVar7);
        pfVar7 = (this->priv->ptag_to_action)._begin[uVar8].repr;
        if (pfVar7 != (features *)0x0) {
          operator_delete(pfVar7);
        }
      }
    }
    aVar6 = a;
    psVar3 = this->priv;
    if ((psVar3->acset).use_passthrough_repr == true) {
      pfVar7 = (features *)operator_new(0x68);
      (pfVar7->values)._begin = (float *)0x0;
      (pfVar7->values)._end = (float *)0x0;
      (pfVar7->values).end_array = (float *)0x0;
      (pfVar7->values).erase_count = 0;
      (pfVar7->indicies)._begin = (unsigned_long *)0x0;
      (pfVar7->indicies)._end = (unsigned_long *)0x0;
      (pfVar7->indicies).end_array = (unsigned_long *)0x0;
      (pfVar7->indicies).erase_count = 0;
      (pfVar7->space_names)._begin =
           (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      (pfVar7->space_names)._end =
           (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      (pfVar7->space_names).end_array =
           (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      (pfVar7->space_names).erase_count = 0;
      pfVar7->sum_feat_sq = 0.0;
      local_48 = oracle_actions_cnt;
      features::deep_copy_from(pfVar7,&psVar3->last_action_repr);
      oracle_actions_cnt = local_48;
    }
    else {
      pfVar7 = (features *)0x0;
    }
    item.repr._0_4_ = mytag;
    item._0_8_ = pfVar7;
    item.repr._4_4_ = 0;
    push_at<Search::action_repr>
              ((Search *)&psVar3->ptag_to_action,(v_array<Search::action_repr> *)(ulong)aVar6,item,
               (size_t)oracle_actions);
  }
  if (this->priv->auto_hamming_loss == true) {
    if (this->priv->use_action_costs == true) {
      loss = action_cost_loss((Search *)(ulong)a,(action)allowed_actions,
                              (action *)allowed_actions_cost,(float *)allowed_actions_cnt,
                              (size_t)oracle_actions);
    }
    else {
      loss = 0.0;
      if ((oracle_actions_cnt != 0) && (*local_40 != a)) {
        uVar8 = 0;
        do {
          if (oracle_actions_cnt - 1 == uVar8) goto LAB_0025f2bc;
          uVar1 = uVar8 + 1;
          lVar5 = uVar8 + 1;
          uVar8 = uVar1;
        } while (local_40[lVar5] != a);
        if (oracle_actions_cnt <= uVar1) {
LAB_0025f2bc:
          loss = 1.0;
        }
      }
    }
    search_declare_loss(this->priv,loss);
  }
  return a;
}

Assistant:

action search::predict(example& ec, ptag mytag, const action* oracle_actions, size_t oracle_actions_cnt,
    const ptag* condition_on, const char* condition_on_names, const action* allowed_actions, size_t allowed_actions_cnt,
    const float* allowed_actions_cost, size_t learner_id, float weight)
{
  float a_cost = 0.;
  action a = search_predict(*priv, &ec, 1, mytag, oracle_actions, oracle_actions_cnt, condition_on, condition_on_names,
      allowed_actions, allowed_actions_cnt, allowed_actions_cost, learner_id, a_cost, weight);
  if (priv->state == INIT_TEST)
    priv->test_action_sequence.push_back(a);
  if (mytag != 0)
  {
    if (mytag < priv->ptag_to_action.size())
    {
      cdbg << "delete_v at " << mytag << endl;
      if (priv->ptag_to_action[mytag].repr != nullptr)
      {
        priv->ptag_to_action[mytag].repr->delete_v();
        delete priv->ptag_to_action[mytag].repr;
      }
    }
    if (priv->acset.use_passthrough_repr)
    {
      assert((mytag >= priv->ptag_to_action.size()) || (priv->ptag_to_action[mytag].repr == nullptr));
      push_at(priv->ptag_to_action, action_repr(a, &(priv->last_action_repr)), mytag);
    }
    else
      push_at(priv->ptag_to_action, action_repr(a, (features*)nullptr), mytag);
    cdbg << "push_at " << mytag << endl;
  }
  if (priv->auto_hamming_loss)
    loss(priv->use_action_costs ? action_cost_loss(a, allowed_actions, allowed_actions_cost, allowed_actions_cnt)
                                : action_hamming_loss(a, oracle_actions, oracle_actions_cnt));
  cdbg << "predict returning " << a << endl;
  return a;
}